

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

float google::protobuf::io::SafeDoubleToFloat(double value)

{
  float fVar1;
  
  if (value <= 3.4028234663852886e+38) {
    if (-3.4028234663852886e+38 <= value) {
      fVar1 = (float)value;
    }
    else if (-3.4028235677973366e+38 <= value) {
      fVar1 = -3.4028235e+38;
    }
    else {
      fVar1 = -INFINITY;
    }
  }
  else if (value <= 3.4028235677973366e+38) {
    fVar1 = 3.4028235e+38;
  }
  else {
    fVar1 = INFINITY;
  }
  return fVar1;
}

Assistant:

float SafeDoubleToFloat(double value) {
  // static_cast<float> on a number larger than float can result in illegal
  // instruction error, so we need to manually convert it to infinity or max.
  if (value > std::numeric_limits<float>::max()) {
    // Max float value is about 3.4028234664E38 when represented as a double.
    // However, when printing float as text, it will be rounded as
    // 3.4028235e+38. If we parse the value of 3.4028235e+38 from text and
    // compare it to 3.4028234664E38, we may think that it is larger, but
    // actually, any number between these two numbers could only be represented
    // as the same max float number in float, so we should treat them the same
    // as max float.
    if (value <= MAX_FLOAT_AS_DOUBLE_ROUNDED) {
      return std::numeric_limits<float>::max();
    }
    return std::numeric_limits<float>::infinity();
  } else if (value < -std::numeric_limits<float>::max()) {
    if (value >= -MAX_FLOAT_AS_DOUBLE_ROUNDED) {
      return -std::numeric_limits<float>::max();
    }
    return -std::numeric_limits<float>::infinity();
  } else {
    return static_cast<float>(value);
  }
}